

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O1

void __thiscall
Imf_3_4::IDManifest::serialize(IDManifest *this,vector<char,_std::allocator<char>_> *data)

{
  long *plVar1;
  char cVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  pointer piVar6;
  pointer ppVar7;
  pointer ppVar8;
  vector<char,_std::allocator<char>_> *pvVar9;
  int iVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  pair<int,_int> *ppVar14;
  undefined8 *puVar15;
  ulong uVar16;
  size_t sVar17;
  _Rb_tree_header *p_Var18;
  _Rb_tree_node_base *p_Var19;
  pointer pCVar20;
  ArgExc *this_00;
  _Base_ptr p_Var21;
  pointer pbVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  pair<int,_int> pVar26;
  pair<int,_int> pVar27;
  pair<int,_int> pVar28;
  pair<int,_int> pVar29;
  pair<int,_int> pVar30;
  pair<int,_int> pVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  uint64_t uVar35;
  IDManifest *pIVar36;
  int iVar37;
  long lVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  char *outPtr;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> RLEmapping;
  vector<char,_std::allocator<char>_> storageSchemes;
  vector<int,_std::allocator<int>_> stringIndices;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sortedIndices;
  string prevString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prefixedStringList;
  indexedStringSet stringSet;
  pair<int,_int> *local_188;
  long local_180;
  pair<int,_int> local_178 [2];
  undefined1 local_168 [16];
  pair<int,_int> local_158;
  pair<int,_int> pStack_150;
  vector<char,_std::allocator<char>_> local_148;
  vector<int,_std::allocator<int>_> local_128;
  undefined8 uStack_110;
  _Rb_tree_node_base *local_108;
  byte local_100 [4];
  undefined4 uStack_fc;
  long local_f8;
  pair<int,_int> local_f0 [2];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_e0;
  undefined1 *local_c8;
  _Base_ptr local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  ulong local_a8;
  ulong local_a0;
  IDManifest *local_98;
  vector<char,_std::allocator<char>_> *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  _Rb_tree_node_base *local_70;
  size_t local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar20 = (this->_manifest).
            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_98 = this;
  local_90 = data;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->_manifest).
      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar20) {
    uVar39 = 0;
    do {
      p_Var12 = pCVar20[uVar39]._table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (p_Var12 !=
             (_Rb_tree_node_base *)
             ((long)&(this->_manifest).
                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar39]._table._M_t + 8U)) {
        p_Var13 = p_Var12[1]._M_parent;
        if (p_Var12[1]._M_left != p_Var13) {
          lVar38 = 0;
          uVar24 = 0;
          do {
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                    *)&local_60,(key_type *)((long)&p_Var13->_M_color + lVar38));
            *pmVar11 = *pmVar11 + 1;
            uVar24 = uVar24 + 1;
            p_Var13 = p_Var12[1]._M_parent;
            lVar38 = lVar38 + 0x20;
          } while (uVar24 < (ulong)((long)p_Var12[1]._M_left - (long)p_Var13 >> 5));
        }
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        this = local_98;
      }
      uVar39 = uVar39 + 1;
      pCVar20 = (this->_manifest).
                super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar39 < (ulong)(((long)(this->_manifest).
                                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar20 >> 4
                              ) * 0x4ec4ec4ec4ec4ec5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,local_60._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)&local_c8);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&local_e0,local_60._M_impl.super__Rb_tree_header._M_node_count,
             (allocator_type *)&local_c8);
  p_Var18 = &local_60._M_impl.super__Rb_tree_header;
  local_c8 = &local_b8;
  local_c0 = (_Base_ptr)0x0;
  local_b8 = 0;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var18) {
    lVar38 = 0;
    p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var19 = p_Var12 + 1;
      if (lVar38 == 0) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        p_Var13 = (_Base_ptr)0xffff;
        if (local_c0 < (_Base_ptr)0xffff) {
          p_Var13 = local_c0;
        }
        if (local_c0 != (_Base_ptr)0x0) {
          p_Var21 = (_Base_ptr)0x0;
          do {
            if ((p_Var12[1]._M_parent == p_Var21) ||
               (local_c8[(long)p_Var21] != *(char *)((long)&p_Var21->_M_color + *(long *)p_Var19)))
            break;
            p_Var21 = (_Base_ptr)((long)&p_Var21->_M_color + 1);
          } while (p_Var13 != p_Var21);
        }
        if (local_c0 < (_Base_ptr)0x100) {
          local_168._0_8_ = &local_158;
          std::__cxx11::string::_M_construct((ulong)local_168,'\x01');
          std::__cxx11::string::substr((ulong)&local_148,(ulong)p_Var19);
          pVar31.first = 0xf;
          pVar31.second = 0;
          if ((pair<int,_int> *)local_168._0_8_ != &local_158) {
            pVar31 = local_158;
          }
          if ((ulong)pVar31 <
              (ulong)((long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish + local_168._8_8_)) {
            pVar28.first = 0xf;
            pVar28.second = 0;
            if ((pointer *)
                local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start !=
                &local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
              pVar28 = (pair<int,_int>)
                       local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            }
            if ((ulong)pVar28 <
                (ulong)((long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish + local_168._8_8_))
            goto LAB_00180a45;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,local_168._0_8_)
            ;
          }
          else {
LAB_00180a45:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (local_168,
                                 (ulong)local_148.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
          }
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          plVar1 = puVar15 + 2;
          if ((pointer *)*puVar15 == (pointer *)plVar1) {
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)*plVar1;
            uStack_110 = puVar15[3];
          }
          else {
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)*plVar1;
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)*puVar15;
          }
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)puVar15[1];
          *puVar15 = plVar1;
          puVar15[1] = 0;
          *(undefined1 *)plVar1 = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     (local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar38),(string *)&local_128);
          if ((pointer *)
              local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 1);
          }
          if ((pointer *)
              local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 1);
          }
          pVar31 = local_158;
          pVar28 = (pair<int,_int>)local_168._0_8_;
          if ((pair<int,_int> *)local_168._0_8_ == &local_158) goto LAB_00180cf3;
        }
        else {
          local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct((ulong)&local_148,'\x01');
          local_188 = local_178;
          std::__cxx11::string::_M_construct((ulong)&local_188,'\x01');
          pVar26.first = 0xf;
          pVar26.second = 0;
          if ((pointer *)
              local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            pVar26 = (pair<int,_int>)
                     local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          }
          if ((ulong)pVar26 <
              (ulong)(local_180 +
                     (long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish)) {
            pVar27.first = 0xf;
            pVar27.second = 0;
            if (local_188 != local_178) {
              pVar27 = local_178[0];
            }
            if ((ulong)pVar27 <
                (ulong)(local_180 +
                       (long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish)) goto LAB_001809bd;
            ppVar14 = (pair<int,_int> *)
                      std::__cxx11::string::replace
                                ((ulong)&local_188,0,(char *)0x0,
                                 (ulong)local_148.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
          }
          else {
LAB_001809bd:
            ppVar14 = (pair<int,_int> *)
                      std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_188);
          }
          pVar31 = (pair<int,_int>)(ppVar14 + 2);
          if (*ppVar14 == pVar31) {
            local_158 = *(pair<int,_int> *)pVar31;
            pStack_150 = ppVar14[3];
            pVar28 = (pair<int,_int>)&local_158;
          }
          else {
            local_158 = *(pair<int,_int> *)pVar31;
            pVar28 = *ppVar14;
          }
          local_168._8_4_ = ppVar14[1].first;
          local_168._12_4_ = ppVar14[1].second;
          local_168._0_4_ = pVar28.first;
          local_168._4_4_ = pVar28.second;
          *ppVar14 = pVar31;
          ppVar14[1].first = 0;
          ppVar14[1].second = 0;
          *(undefined1 *)pVar31 = 0;
          std::__cxx11::string::substr((ulong)local_100,(ulong)p_Var19);
          pVar29.first = 0xf;
          pVar29.second = 0;
          if ((pair<int,_int> *)local_168._0_8_ != &local_158) {
            pVar29 = local_158;
          }
          pVar31 = (pair<int,_int>)((long)(int *)local_168._8_8_ + local_f8);
          if ((ulong)pVar29 < (ulong)pVar31) {
            pVar30.first = 0xf;
            pVar30.second = 0;
            if ((pair<int,_int> *)
                CONCAT44(uStack_fc,
                         CONCAT13(local_100[3],
                                  CONCAT12(local_100[2],CONCAT11(local_100[1],local_100[0])))) !=
                local_f0) {
              pVar30 = local_f0[0];
            }
            if ((ulong)pVar30 < (ulong)pVar31) goto LAB_00180b18;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,local_168._0_8_);
          }
          else {
LAB_00180b18:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                (local_168,
                                 CONCAT44(uStack_fc,
                                          CONCAT13(local_100[3],
                                                   CONCAT12(local_100[2],
                                                            CONCAT11(local_100[1],local_100[0])))));
          }
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          plVar1 = puVar15 + 2;
          if ((pointer *)*puVar15 == (pointer *)plVar1) {
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)*plVar1;
            uStack_110 = puVar15[3];
          }
          else {
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)*plVar1;
            local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)*puVar15;
          }
          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)puVar15[1];
          *puVar15 = plVar1;
          puVar15[1] = 0;
          *(undefined1 *)plVar1 = 0;
          std::__cxx11::string::operator=
                    ((string *)
                     (local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar38),(string *)&local_128);
          if ((pointer *)
              local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage + 1);
          }
          ppVar14 = (pair<int,_int> *)
                    CONCAT44(uStack_fc,
                             CONCAT13(local_100[3],
                                      CONCAT12(local_100[2],CONCAT11(local_100[1],local_100[0]))));
          if (ppVar14 != local_f0) {
            operator_delete(ppVar14,(long)local_f0[0] + 1);
          }
          if ((pair<int,_int> *)local_168._0_8_ != &local_158) {
            operator_delete((void *)local_168._0_8_,(long)local_158 + 1);
          }
          if (local_188 != local_178) {
            operator_delete(local_188,(long)local_178[0] + 1);
          }
          pVar31 = (pair<int,_int>)
                   local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          pVar28 = (pair<int,_int>)
                   local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((pointer *)
              local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start ==
              &local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) goto LAB_00180cf3;
        }
        operator_delete((void *)pVar28,(long)pVar31 + 1);
      }
LAB_00180cf3:
      std::__cxx11::string::_M_assign((string *)&local_c8);
      local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar38].first = -p_Var12[2]._M_color;
      local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar38].second = (_Rb_tree_color)lVar38;
      p_Var12[2]._M_color = (_Rb_tree_color)lVar38;
      lVar38 = lVar38 + 1;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var18);
  }
  ppVar8 = local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar39 = (long)local_e0.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_e0.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar38 = 0x3f;
    if (uVar39 != 0) {
      for (; uVar39 >> lVar38 == 0; lVar38 = lVar38 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_e0.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_e0.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar38 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar7,ppVar8);
  }
  ppVar8 = local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar39 = (long)local_e0.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_e0.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  if (local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar24 = 0;
  }
  else {
    uVar33 = 0x80;
    if (uVar39 < 0x80) {
      uVar33 = uVar39;
    }
    uVar24 = 0;
    do {
      local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar24].first = 1;
      uVar24 = uVar24 + 1;
    } while (uVar33 + (uVar33 == 0) != uVar24);
  }
  uVar33 = 0x4000;
  if (uVar39 < 0x4000) {
    uVar33 = uVar39;
  }
  if (uVar24 < uVar33) {
    do {
      local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar24].first = 2;
      uVar24 = uVar24 + 1;
    } while (uVar33 != uVar24);
  }
  uVar33 = 0x200000;
  if (uVar39 < 0x200000) {
    uVar33 = uVar39;
  }
  if (uVar24 < uVar33) {
    do {
      local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar24].first = 3;
      uVar24 = uVar24 + 1;
    } while (uVar33 != uVar24);
  }
  uVar33 = 0x10000000;
  if (uVar39 < 0x10000000) {
    uVar33 = uVar39;
  }
  if (uVar24 < uVar33) {
    do {
      local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar24].first = 4;
      uVar24 = uVar24 + 1;
    } while (uVar33 != uVar24);
  }
  auVar5 = _DAT_001b4370;
  auVar44 = _DAT_001b4270;
  auVar43 = _DAT_001b34a0;
  lVar38 = uVar39 - uVar24;
  if (uVar24 <= uVar39 && lVar38 != 0) {
    lVar32 = lVar38 + -1;
    auVar40._8_4_ = (int)lVar32;
    auVar40._0_8_ = lVar32;
    auVar40._12_4_ = (int)((ulong)lVar32 >> 0x20);
    uVar33 = 0;
    auVar40 = auVar40 ^ _DAT_001b34a0;
    do {
      auVar41._8_4_ = (int)uVar33;
      auVar41._0_8_ = uVar33;
      auVar41._12_4_ = (int)(uVar33 >> 0x20);
      auVar42 = (auVar41 | auVar44) ^ auVar43;
      iVar10 = auVar40._4_4_;
      if ((bool)(~(auVar42._4_4_ == iVar10 && auVar40._0_4_ < auVar42._0_4_ ||
                  iVar10 < auVar42._4_4_) & 1)) {
        local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar24 + uVar33].first = 5;
      }
      if ((auVar42._12_4_ != auVar40._12_4_ || auVar42._8_4_ <= auVar40._8_4_) &&
          auVar42._12_4_ <= auVar40._12_4_) {
        local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar24 + uVar33 + 1].first = 5;
      }
      auVar41 = (auVar41 | auVar5) ^ auVar43;
      iVar23 = auVar41._4_4_;
      if (iVar23 <= iVar10 && (iVar23 != iVar10 || auVar41._0_4_ <= auVar40._0_4_)) {
        local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar24 + uVar33 + 2].first = 5;
        local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar24 + uVar33 + 3].first = 5;
      }
      uVar33 = uVar33 + 4;
    } while ((lVar38 + 3U & 0xfffffffffffffffc) != uVar33);
  }
  if (local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar38 = 0x3f;
    if (uVar39 != 0) {
      for (; uVar39 >> lVar38 == 0; lVar38 = lVar38 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_e0.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_e0.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar38 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar7,ppVar8);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_128,
             (long)local_e0.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_e0.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_168);
  pIVar36 = local_98;
  local_168 = (undefined1  [16])0x0;
  local_158.first = 0;
  local_158.second = 0;
  if (local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_168,1);
    ppVar7 = local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    iVar10 = (local_e0.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start)->second;
    *(int *)local_168._0_8_ = iVar10;
    *(int *)(local_168._0_8_ + 4) = iVar10;
    if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      memset(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,0xff,
             ((ulong)((long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish +
                     (-4 - (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start)) & 0xfffffffffffffffc) + 4);
    }
    *(undefined4 *)((long)piVar6 + (long)ppVar7->second * 4) = 0;
    if (8 < (ulong)((long)local_e0.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_e0.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      uVar39 = (ulong)(*(int *)((long)piVar6 + (long)ppVar7->second * 4) + 1);
      uVar24 = 1;
      do {
        if (local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar24].second == (int)uVar39) {
          ((pair<int,_int> *)(local_168._8_8_ + -8))->second =
               local_e0.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar24].second;
        }
        else {
          local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_e0.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar24].second,
                                       local_e0.
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar24].second);
          if ((pair<int,_int>)local_168._8_8_ == local_158) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>const&>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)local_168,
                       (iterator)local_168._8_8_,(pair<int,_int> *)&local_148);
          }
          else {
            *(pointer *)local_168._8_8_ =
                 local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_168._8_8_ = (pair<int,_int> *)(local_168._8_8_ + 8);
          }
        }
        *(int *)((long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start +
                (long)local_e0.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar24].second * 4) = (int)uVar24;
        uVar16 = (ulong)local_e0.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar24].second;
        uVar39 = (ulong)((long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2;
        iVar10 = (int)uVar39;
        uVar25 = local_e0.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar24].second + 1;
        uVar34 = (ulong)uVar25;
        uVar33 = uVar16;
        if ((int)uVar25 <= iVar10) {
          uVar34 = uVar39 & 0xffffffff;
        }
        do {
          uVar33 = uVar33 + 1;
          uVar39 = uVar34;
          if ((long)iVar10 <= (long)uVar33) break;
          uVar39 = (ulong)((int)uVar16 + 1);
          uVar16 = uVar39;
        } while (-1 < *(int *)((long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start + uVar33 * 4));
        uVar24 = uVar24 + 1;
      } while (uVar24 < (ulong)((long)local_e0.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_e0.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  if (local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar10 = 0x10;
  }
  else {
    iVar10 = 4;
    pbVar22 = local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar35 = pbVar22->_M_string_length;
      sVar17 = anon_unknown_4::getVariableLengthIntegerSize(uVar35);
      iVar10 = (int)sVar17 + (int)uVar35 + iVar10;
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 !=
             local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    iVar10 = iVar10 + 0xc;
  }
  iVar10 = (local_168._8_4_ - local_168._0_4_ & 0xfffffff8) + iVar10;
  local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pCVar20 = (pIVar36->_manifest).
            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pIVar36->_manifest).
      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar20) {
    uVar39 = 0;
    do {
      local_a8 = uVar39 * 0xd0;
      p_Var18 = &pCVar20[uVar39]._channels._M_t._M_impl.super__Rb_tree_header;
      p_Var19 = pCVar20[uVar39]._channels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar37 = 4;
      iVar23 = 4;
      local_a0 = uVar39;
      if ((_Rb_tree_header *)p_Var19 != p_Var18) {
        iVar23 = 4;
        local_108 = &p_Var18->_M_header;
        do {
          p_Var12 = p_Var19[1]._M_parent;
          sVar17 = anon_unknown_4::getVariableLengthIntegerSize((uint64_t)p_Var12);
          iVar23 = (int)sVar17 + (int)p_Var12 + iVar23;
          p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
        } while (p_Var19 != local_108);
      }
      uVar39 = local_a8;
      lVar38 = *(long *)((long)&(pCVar20->_components).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_a8);
      lVar32 = *(long *)((long)&(pCVar20->_components).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + local_a8);
      if (lVar38 != lVar32) {
        iVar37 = 4;
        do {
          local_108 = (_Rb_tree_node_base *)
                      CONCAT44(local_108._4_4_,(int)*(uint64_t *)(lVar38 + 8) + iVar37);
          sVar17 = anon_unknown_4::getVariableLengthIntegerSize(*(uint64_t *)(lVar38 + 8));
          iVar37 = (int)sVar17 + (uint)local_108;
          lVar38 = lVar38 + 0x20;
        } while (lVar38 != lVar32);
      }
      iVar10 = iVar10 + iVar23 + iVar37 +
               *(int *)((long)&(pCVar20->_hashScheme)._M_string_length + uVar39) +
               *(int *)((long)&(pCVar20->_encodingScheme)._M_string_length + uVar39) + 0xe;
      p_Var19 = *(_Rb_tree_node_base **)
                 ((long)&(pCVar20->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                 uVar39);
      local_70 = (_Rb_tree_node_base *)
                 ((long)&(pCVar20->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 uVar39);
      uVar24 = 0;
      uVar25 = 1;
      if (p_Var19 != local_70) {
        local_a8 = 0;
        do {
          uVar33 = *(ulong *)(p_Var19 + 1) - local_a8;
          local_a8 = *(ulong *)(p_Var19 + 1);
          local_68 = anon_unknown_4::getVariableLengthIntegerSize(uVar33);
          uVar25 = uVar25 & 0xff;
          if (uVar33 >> 0x20 != 0) {
            uVar25 = 0;
          }
          local_108 = (_Rb_tree_node_base *)CONCAT44(local_108._4_4_,uVar25);
          if (*(long *)((long)&(pCVar20->_components).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + uVar39) !=
              *(long *)((long)&(pCVar20->_components).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar39)) {
            lVar38 = 0;
            uVar33 = 0;
            do {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)&local_60,
                                     (key_type *)((long)&(p_Var19[1]._M_parent)->_M_color + lVar38))
              ;
              sVar17 = anon_unknown_4::getVariableLengthIntegerSize
                                 ((long)*(int *)((long)local_128.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start +
                                                (long)*pmVar11 * 4));
              iVar10 = iVar10 + (int)sVar17;
              uVar33 = uVar33 + 1;
              lVar38 = lVar38 + 0x20;
            } while (uVar33 < (ulong)(*(long *)((long)&(pCVar20->_components).
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                               uVar39) -
                                      *(long *)((long)&(pCVar20->_components).
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar39
                                               ) >> 5));
          }
          uVar24 = uVar24 + local_68;
          p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
          uVar25 = (uint)local_108;
        } while (p_Var19 != local_70);
      }
      pIVar36 = local_98;
      lVar38 = *(long *)((long)&(pCVar20->_table)._M_t._M_impl.super__Rb_tree_header._M_node_count +
                        uVar39);
      if ((uVar25 & 1) == 0) {
        if (uVar24 < (ulong)(lVar38 << 3)) {
          local_188 = (pair<int,_int> *)CONCAT71(local_188._1_7_,2);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    (&local_148,(char *)&local_188);
          goto LAB_00181350;
        }
        local_188 = (pair<int,_int> *)((ulong)local_188._1_7_ << 8);
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_148,(char *)&local_188);
        iVar10 = iVar10 + *(int *)((long)&(pCVar20->_table)._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count + uVar39) * 8;
      }
      else if (uVar24 < (ulong)(lVar38 << 2)) {
        local_188 = (pair<int,_int> *)CONCAT71(local_188._1_7_,2);
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_148,(char *)&local_188);
LAB_00181350:
        iVar10 = iVar10 + (int)uVar24;
      }
      else {
        local_188 = (pair<int,_int> *)CONCAT71(local_188._1_7_,1);
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_148,(char *)&local_188);
        iVar10 = iVar10 + *(int *)((long)&(pCVar20->_table)._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count + uVar39) * 4;
      }
      uVar39 = local_a0 + 1;
      pCVar20 = (pIVar36->_manifest).
                super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar39 < (ulong)(((long)(pIVar36->_manifest).
                                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar20 >> 4
                              ) * 0x4ec4ec4ec4ec4ec5));
  }
  pvVar9 = local_90;
  std::vector<char,_std::allocator<char>_>::resize(local_90,(long)iVar10);
  local_100[0] = 0;
  local_100[1] = 0;
  local_100[2] = 0;
  local_100[3] = 0;
  lVar38 = 0;
  ppVar14 = (pair<int,_int> *)
            (pvVar9->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    local_188 = ppVar14;
    ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
    *(byte *)&local_188->first = local_100[lVar38];
    lVar38 = lVar38 + 1;
  } while ((int)lVar38 != 4);
  iVar10 = (int)local_188;
  local_188 = ppVar14;
  (anonymous_namespace)::
  writeStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((char **)&local_188,&local_88,iVar10);
  uVar39 = local_168._8_8_ - local_168._0_8_;
  local_100[0] = (byte)(uVar39 >> 3);
  local_100[1] = (char)(uVar39 >> 0xb);
  local_100[2] = (char)(uVar39 >> 0x13);
  local_100[3] = (char)(uVar39 >> 0x1b);
  lVar38 = 0;
  do {
    ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
    *(byte *)&local_188->first = local_100[lVar38];
    lVar38 = lVar38 + 1;
    local_188 = ppVar14;
  } while ((int)lVar38 != 4);
  if (local_168._8_8_ != local_168._0_8_) {
    uVar39 = 0;
    do {
      iVar10 = ((pointer)(local_168._0_8_ + uVar39 * 8))->first;
      local_100[0] = (byte)iVar10;
      local_100[1] = (byte)((uint)iVar10 >> 8);
      local_100[2] = (byte)((uint)iVar10 >> 0x10);
      local_100[3] = (byte)((uint)iVar10 >> 0x18);
      lVar38 = 0;
      do {
        ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
        *(byte *)&local_188->first = local_100[lVar38];
        lVar38 = lVar38 + 1;
        local_188 = ppVar14;
      } while ((int)lVar38 != 4);
      iVar10 = ((pointer)(local_168._0_8_ + uVar39 * 8))->second;
      local_100[0] = (byte)iVar10;
      local_100[1] = (byte)((uint)iVar10 >> 8);
      local_100[2] = (byte)((uint)iVar10 >> 0x10);
      local_100[3] = (byte)((uint)iVar10 >> 0x18);
      lVar38 = 0;
      do {
        ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
        *(byte *)&local_188->first = local_100[lVar38];
        lVar38 = lVar38 + 1;
        local_188 = ppVar14;
      } while ((int)lVar38 != 4);
      uVar39 = uVar39 + 1;
    } while (uVar39 < (ulong)((long)(local_168._8_8_ - local_168._0_8_) >> 3));
  }
  iVar10 = (int)((ulong)((long)(pIVar36->_manifest).
                               super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pIVar36->_manifest).
                              super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x3b13b13b;
  local_100[0] = (byte)iVar10;
  local_100[1] = (byte)((uint)iVar10 >> 8);
  local_100[2] = (byte)((uint)iVar10 >> 0x10);
  local_100[3] = (byte)((uint)iVar10 >> 0x18);
  lVar38 = 0;
  do {
    ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
    *(byte *)&local_188->first = local_100[lVar38];
    lVar38 = lVar38 + 1;
    local_188 = ppVar14;
  } while ((int)lVar38 != 4);
  pCVar20 = (pIVar36->_manifest).
            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pIVar36->_manifest).
      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar20) {
    uVar39 = 0;
    do {
      uVar3 = (undefined4)pCVar20[uVar39]._channels._M_t._M_impl.super__Rb_tree_header._M_node_count
      ;
      local_100[0] = (byte)uVar3;
      local_100[1] = (byte)((uint)uVar3 >> 8);
      local_100[2] = (byte)((uint)uVar3 >> 0x10);
      local_100[3] = (byte)((uint)uVar3 >> 0x18);
      lVar38 = 0;
      ppVar14 = local_188;
      do {
        local_188 = ppVar14;
        ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
        *(byte *)&local_188->first = local_100[lVar38];
        lVar38 = lVar38 + 1;
      } while ((int)lVar38 != 4);
      auVar43._8_8_ = local_188;
      auVar43._0_8_ = pCVar20[uVar39]._channels._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      p_Var18 = &pCVar20[uVar39]._channels._M_t._M_impl.super__Rb_tree_header;
      local_188 = ppVar14;
      while( true ) {
        p_Var19 = auVar43._0_8_;
        if ((_Rb_tree_header *)p_Var19 == p_Var18) break;
        uVar24 = (long)*(int *)&p_Var19[1]._M_parent;
        do {
          ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
          *(byte *)&local_188->first = (0x7f < uVar24) << 7 | (byte)uVar24 & 0x7f;
          bVar4 = 0x7f < uVar24;
          uVar24 = uVar24 >> 7;
          local_188 = ppVar14;
        } while (bVar4);
        auVar43 = std::_Rb_tree_increment(p_Var19);
      }
      auVar44._8_8_ = auVar43._8_8_;
      auVar44._0_8_ = pCVar20[uVar39]._channels._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      while (p_Var19 = auVar44._0_8_, (_Rb_tree_header *)p_Var19 != p_Var18) {
        iVar10 = (int)p_Var19[1]._M_parent;
        if (iVar10 != 0) {
          lVar38 = *(long *)(p_Var19 + 1);
          lVar32 = 0;
          do {
            ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
            *(char *)&local_188->first = *(char *)(lVar38 + lVar32);
            lVar32 = lVar32 + 1;
            local_188 = ppVar14;
          } while (iVar10 != (int)lVar32);
        }
        auVar44 = std::_Rb_tree_increment(p_Var19);
      }
      (anonymous_namespace)::
      writeStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((char **)&local_188,&pCVar20[uVar39]._components,auVar44._8_4_);
      *(char *)&local_188->first = (char)pCVar20[uVar39]._lifeTime;
      local_188 = (pair<int,_int> *)((long)&local_188->first + 1);
      anon_unknown_4::writePascalString((char **)&local_188,&pCVar20[uVar39]._hashScheme);
      anon_unknown_4::writePascalString((char **)&local_188,&pCVar20[uVar39]._encodingScheme);
      local_a8 = uVar39;
      cVar2 = *(char *)((long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar39);
      *(char *)&local_188->first = cVar2;
      uVar3 = (undefined4)pCVar20[uVar39]._table._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_100[0] = (byte)uVar3;
      local_100[1] = (byte)((uint)uVar3 >> 8);
      local_100[2] = (byte)((uint)uVar3 >> 0x10);
      local_100[3] = (byte)((uint)uVar3 >> 0x18);
      lVar38 = 0;
      local_188 = (pair<int,_int> *)((long)&local_188->first + 1);
      do {
        ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
        *(byte *)&local_188->first = local_100[lVar38];
        lVar38 = lVar38 + 1;
        local_188 = ppVar14;
      } while ((int)lVar38 != 4);
      p_Var12 = pCVar20[uVar39]._table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_108 = &pCVar20[uVar39]._table._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var12 != local_108) {
        lVar38 = 0;
        do {
          uVar35 = *(long *)(p_Var12 + 1) - lVar38;
          if (cVar2 == '\0') {
            Xdr::write<Imf_3_4::CharPtrIO,char*>((char **)&local_188,uVar35);
          }
          else if (cVar2 == '\x01') {
            local_100[0] = (byte)uVar35;
            local_100[1] = (byte)(uVar35 >> 8);
            local_100[2] = (byte)(uVar35 >> 0x10);
            local_100[3] = (byte)(uVar35 >> 0x18);
            lVar38 = 0;
            do {
              ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
              *(byte *)&local_188->first = local_100[lVar38];
              lVar38 = lVar38 + 1;
              local_188 = ppVar14;
            } while ((int)lVar38 != 4);
          }
          else if (cVar2 == '\x02') {
            do {
              ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
              *(byte *)&local_188->first = (0x7f < uVar35) << 7 | (byte)uVar35 & 0x7f;
              bVar4 = 0x7f < uVar35;
              uVar35 = uVar35 >> 7;
              local_188 = ppVar14;
            } while (bVar4);
          }
          lVar38 = *(long *)(p_Var12 + 1);
          if (pCVar20[uVar39]._components.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              pCVar20[uVar39]._components.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar24 = 0;
            do {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)&local_60,(key_type *)(p_Var12[1]._M_parent + uVar24));
              uVar33 = (long)*(int *)((long)local_128.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                     (long)*pmVar11 * 4);
              do {
                ppVar14 = (pair<int,_int> *)((long)&local_188->first + 1);
                *(byte *)&local_188->first = (0x7f < uVar33) << 7 | (byte)uVar33 & 0x7f;
                bVar4 = 0x7f < uVar33;
                uVar33 = uVar33 >> 7;
                local_188 = ppVar14;
              } while (bVar4);
              uVar24 = uVar24 + 1;
            } while (uVar24 < (ulong)((long)pCVar20[uVar39]._components.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pCVar20[uVar39]._components.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        } while (p_Var12 != local_108);
      }
      uVar39 = local_a8 + 1;
      pCVar20 = (local_98->_manifest).
                super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar39 < (ulong)(((long)(local_98->_manifest).
                                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar20 >> 4
                              ) * 0x4ec4ec4ec4ec4ec5));
  }
  if (local_188 ==
      (pair<int,_int> *)
      (local_90->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    if ((pair<int,_int>)
        local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pair<int,_int>)0x0) {
      operator_delete(local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_168._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_168._0_8_,(long)local_158 - local_168._0_8_);
    }
    if ((pointer *)
        local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    }
    if (local_e0.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e0.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&local_60);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Error - IDManifest size error");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
IDManifest::serialize (std::vector<char>& data) const
{

    indexedStringSet stringSet;

    //
    // build string map - this turns unique strings into indices
    // the manifest stores the string indices - this allows duplicated
    // strings to point to the same place
    // grabs all the strings regardless of which manifest/mapping they are in
    //
    // at this point we just count the manifest entries
    //
    {
        //
        // over each channel group
        //
        for (size_t m = 0; m < _manifest.size (); ++m)
        {
            // over each mapping
            for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                     _manifest[m]._table.begin ();
                 i != _manifest[m]._table.end ();
                 ++i)
            {
                // over each string in the mapping

                for (size_t s = 0; s < i->second.size (); ++s)
                {
                    stringSet[i->second[s]]++;
                }
            }
        }
    }

    //
    // build compressed string representation - all but first string starts with number of characters to copy from previous string.
    // max 65535 bytes - use two bytes to store if previous string was more than 255 characters, big endian
    //
    vector<string> prefixedStringList (stringSet.size ());

    //
    // also make a sorted list so the most common entry appears first. Keep equally likely entries in numerical order
    //
    vector<pair<int, int>> sortedIndices (stringSet.size ());

    string prevString;
    int    index = 0;
    for (indexedStringSet::iterator i = stringSet.begin ();
         i != stringSet.end ();
         ++i)
    {

        // no prefix on first string - map stores index of each string, so use that rather than a counter;
        if (index == 0) { prefixedStringList[index] = i->first; }
        else
        {
            size_t common = 0;
            while (common < 65535 && common < prevString.size () &&
                   common < i->first.size () &&
                   prevString[common] == i->first[common])
            {
                ++common;
            }

            if (prevString.size () > 255)
            {
                //
                // long previous string - use two bytes to encode number of common chars
                //
                prefixedStringList[index] = string (1, char (common >> 8)) +
                                            string (1, char (common & 255)) +
                                            i->first.substr (common);
            }
            else
            {
                prefixedStringList[index] =
                    string (1, char (common)) + i->first.substr (common);
            }
        }
        prevString = i->first;
        sortedIndices[index].first =
            -i->second; // use negative of count so largest count appears first
        sortedIndices[index].second = index;

        //
        // also, repurpose stringSet so that it maps from string names to indices in the string table
        //
        i->second = index;

        index++;
    }

    sort (sortedIndices.begin (), sortedIndices.end ());

    //
    // the first 1<<7 characters will all be encoded with 1 byte, regardless of how common they are
    // the next 1<<14 characters will be encoded with 2 bytes
    // (a full huffman encode would do this at the bit level, not the byte level)
    //
    // the mapping table can be reduced in size by rewriting the IDs to exploit that
    // can rearrange the IDs to have more long runs by sorting numbers
    // that will need the same number of bytes to encode together
    //
    {
        size_t i = 0;

        for (; i < sortedIndices.size () && i < 1 << 7; ++i)
        {
            sortedIndices[i].first = 1;
        }
        for (; i < sortedIndices.size () && i < 1 << 14; ++i)
        {
            sortedIndices[i].first = 2;
        }
        for (; i < sortedIndices.size () && i < 1 << 21; ++i)
        {
            sortedIndices[i].first = 3;
        }
        for (; i < sortedIndices.size () && i < 1 << 28; ++i)
        {
            sortedIndices[i].first = 4;
        }
        for (; i < sortedIndices.size (); ++i)
        {
            sortedIndices[i].first = 5;
        }
    }
    sort (sortedIndices.begin (), sortedIndices.end ());

    vector<int> stringIndices (sortedIndices.size ());

    //
    // table will be stored with RLE encoding - store pairs of 'start index,end index'
    // so, the sequence 10,11,12,1,2,3,4  is stored as [ (10,12) , (1,4)]
    //
    // sequential IDs ignore already referenced IDs, so the sequence  11,9,10,12,13 can be stored as [ (11,11) , (9,13)]
    // on reading, don't reference an entry that has already been seen
    // on writing, need to track which entries have already been stored to allow this overlapping to occur
    //

    vector<pair<int, int>> RLEmapping;

    if (sortedIndices.size () > 0)
    {
        RLEmapping.resize (1);
        RLEmapping[0].first  = sortedIndices[0].second;
        RLEmapping[0].second = sortedIndices[0].second;

        fill (stringIndices.begin (), stringIndices.end (), -1);

        stringIndices[sortedIndices[0].second] = 0;

        //
        // as the loop below runs, nextToInclude tracks the value that can be merged with the current run length
        // (RLWmapping.back()) - generally this is on more than the current length, but it jumps forward
        // over values already seen
        //
        int nextToInclude = stringIndices[sortedIndices[0].second] + 1;

        for (size_t i = 1; i < sortedIndices.size (); ++i)
        {
            if (sortedIndices[i].second == nextToInclude)
            {
                //
                // this index can be treated as part of the current run, so extend the run to include it
                //
                RLEmapping.back ().second = sortedIndices[i].second;
            }
            else
            {
                pair<int, int> newEntry (
                    sortedIndices[i].second, sortedIndices[i].second);
                RLEmapping.push_back (newEntry);
            }
            // build mapping for this entry
            stringIndices[sortedIndices[i].second] = i;

            // what would the next entry have to be to be included in this run
            // skip over already mapped strings
            nextToInclude = sortedIndices[i].second + 1;

            while (nextToInclude < int (stringIndices.size ()) &&
                   stringIndices[nextToInclude] >= 0)
            {
                nextToInclude++;
            }
        }
    }
#ifdef DUMP_TABLE
    // dump RLE table for debugging
    for (size_t i = 1; i < sortedIndices.size (); ++i)
    {
        std::cout << i << ' ' << sortedIndices[i].second << std::endl;
    }
#endif

    // now compute size of uncompressed memory block for serialization

    int outputSize =
        8; // at least need four bytes for integer to store number of channel manifests, plus four bytes to indicate version pattern

    outputSize += getStringListSize (prefixedStringList);

    //
    // RLE mapping table size - number of entries followed by eight bytes for each run length
    //
    outputSize += RLEmapping.size () * 8 + 4;

    //
    // track which storage scheme is optimal for storing the IDs of each type
    // ID storage scheme: 0 = 8 bytes per ID, 1 = 4 bytes per ID, 2 = variable
    //

    std::vector<char> storageSchemes;

    for (size_t groupNumber = 0; groupNumber < _manifest.size (); ++groupNumber)
    {
        const ChannelGroupManifest& m = _manifest[groupNumber];
        outputSize += getStringListSize (m._channels); //size of channel group
        outputSize +=
            getStringListSize (m._components); //size of component list
        outputSize += 1;                       //size of lifetime enum
        outputSize += getStringSize (m._hashScheme);
        outputSize += getStringSize (m._encodingScheme);

        outputSize += 1; // ID scheme
        outputSize +=
            4; // size of storage for number of 32 bit entries in ID table

        uint64_t previousId                 = 0;
        uint64_t IdStorageForVariableScheme = 0;
        bool     canUse32Bits               = true;
        for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                 m._table.begin ();
             i != m._table.end ();
             ++i)
        {

            uint64_t idToStore = i->first - previousId;
            IdStorageForVariableScheme +=
                getVariableLengthIntegerSize (idToStore);
            if (idToStore >= 1llu << 32) { canUse32Bits = false; }
            previousId = i->first;

            for (size_t s = 0; s < m._components.size (); ++s)
            {
                int stringID  = stringSet[i->second[s]];
                int idToWrite = stringIndices[stringID];
                outputSize += getVariableLengthIntegerSize (idToWrite);
            }
        }
        // pick best scheme to use to store IDs
        if (canUse32Bits)
        {
            if (IdStorageForVariableScheme < m._table.size () * 4)
            {
                //
                // variable storage smaller than fixed 32 bit, so use that
                //
                storageSchemes.push_back (2);
                outputSize += IdStorageForVariableScheme;
            }
            else
            {
                //
                // variable scheme bigger than fixed 32 bit, but all ID differences fit into 32 bits
                //
                storageSchemes.push_back (1);
                outputSize += m._table.size () * 4;
            }
        }
        else
        {
            if (IdStorageForVariableScheme < m._table.size () * 8)
            {
                //
                // variable storage smaller than fixed 64 bit, so use that
                //
                storageSchemes.push_back (2);
                outputSize += IdStorageForVariableScheme;
            }
            else
            {
                //
                // variable scheme bigger than fixed 64 bit, and some ID differences bigger than 32 bit
                //
                storageSchemes.push_back (0);
                outputSize += m._table.size () * 8;
            }
        }
    }

    //
    // resize output array
    //
    data.resize (outputSize);

    //
    // populate output array
    //
    char* outPtr = &data[0];

    //
    // zeroes to indicate this is version 0 of the header
    //
    Xdr::write<CharPtrIO> (outPtr, int (0));

    //
    // table of strings
    //
    writeStringList (outPtr, prefixedStringList);

    //
    // RLE block
    //
    Xdr::write<CharPtrIO> (outPtr, int (RLEmapping.size ()));
    for (size_t i = 0; i < RLEmapping.size (); ++i)
    {
        Xdr::write<CharPtrIO> (outPtr, RLEmapping[i].first);
        Xdr::write<CharPtrIO> (outPtr, RLEmapping[i].second);
    }

    //
    // number of manifests
    //
    Xdr::write<CharPtrIO> (outPtr, int (_manifest.size ()));
    int manifestIndex = 0;

    for (size_t groupNumber = 0; groupNumber < _manifest.size (); ++groupNumber)
    {
        const ChannelGroupManifest& m = _manifest[groupNumber];
        //
        // manifest header
        //
        writeStringList (outPtr, m._channels);
        writeStringList (outPtr, m._components);
        Xdr::write<CharPtrIO> (outPtr, char (m._lifeTime));
        writePascalString (outPtr, m._hashScheme);
        writePascalString (outPtr, m._encodingScheme);

        char scheme = storageSchemes[manifestIndex];
        Xdr::write<CharPtrIO> (outPtr, scheme);

        Xdr::write<CharPtrIO> (outPtr, int (m._table.size ()));

        uint64_t previousId = 0;
        //
        // table
        //
        for (IDManifest::ChannelGroupManifest::IDTable::const_iterator i =
                 m._table.begin ();
             i != m._table.end ();
             ++i)
        {

            uint64_t idToWrite = i->first - previousId;
            switch (scheme)
            {
                case 0: Xdr::write<CharPtrIO> (outPtr, idToWrite); break;
                case 1:
                    Xdr::write<CharPtrIO> (outPtr, (unsigned int) idToWrite);
                    break;
                case 2: writeVariableLengthInteger (outPtr, idToWrite);
            }

            previousId = i->first;

            for (size_t s = 0; s < m._components.size (); ++s)
            {
                int stringID  = stringSet[i->second[s]];
                int idToWrite = stringIndices[stringID];
                writeVariableLengthInteger (outPtr, idToWrite);
            }
        }
        manifestIndex++;
    }
    //
    // check we've written the ID manifest correctly
    //
    if (outPtr != &data[0] + data.size ())
    {
        throw IEX_NAMESPACE::ArgExc ("Error - IDManifest size error");
    }
}